

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O0

WindowsPath * __thiscall
WindowsPath::GetFolder(WindowsPath *__return_storage_ptr__,WindowsPath *this)

{
  WindowsPath *this_local;
  WindowsPath *newPath;
  
  WindowsPath(__return_storage_ptr__);
  SetDriveLetter(__return_storage_ptr__,&this->mDriveLetter);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->mPathComponents,&this->mPathComponents);
  PopPathComponent(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

WindowsPath WindowsPath::GetFolder() const
{
	WindowsPath newPath;
    
	// in edge case of drive letter only, will return the same path. in empty relative, will enter empty relative
	// in all other cases will return a path which is the same drive letter, and with one less component from the component list
    
	newPath.SetDriveLetter(mDriveLetter);
	newPath.mPathComponents = mPathComponents;
	newPath.PopPathComponent();
	return newPath;
}